

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.h
# Opt level: O3

bool __thiscall
CCommandBuffer::AddCommand<CCommandBuffer::CScreenshotCommand>
          (CCommandBuffer *this,CScreenshotCommand *Command)

{
  uint uVar1;
  uchar *puVar2;
  CCommand *pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined4 uVar7;
  CCommand *pCVar8;
  ulong uVar9;
  ulong uVar10;
  
  puVar2 = (this->m_CmdBuffer).m_pData;
  uVar1 = (this->m_CmdBuffer).m_Used;
  uVar10 = (ulong)((int)puVar2 + uVar1 & 7);
  uVar9 = (uVar1 - uVar10) + 0x30;
  if (uVar9 <= (this->m_CmdBuffer).m_Size) {
    lVar6 = uVar1 - uVar10;
    (this->m_CmdBuffer).m_Used = (uint)uVar9;
    pCVar8 = (CCommand *)(puVar2 + lVar6 + 8);
    if (pCVar8 != (CCommand *)0x0) {
      uVar7 = *(undefined4 *)&(Command->super_CCommand).field_0x4;
      pCVar3 = (Command->super_CCommand).m_pNext;
      uVar4 = *(undefined8 *)&Command->m_X;
      uVar5 = *(undefined8 *)&Command->m_W;
      pCVar8->m_Cmd = (Command->super_CCommand).m_Cmd;
      *(undefined4 *)&pCVar8->field_0x4 = uVar7;
      *(CCommand **)(puVar2 + lVar6 + 0x10) = pCVar3;
      *(CImageInfo **)(puVar2 + lVar6 + 0x28) = Command->m_pImage;
      *(undefined8 *)(puVar2 + lVar6 + 0x18) = uVar4;
      *(undefined8 *)(puVar2 + lVar6 + 0x20) = uVar5;
      puVar2 = puVar2 + lVar6 + 0x10;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      if (this->m_pCmdBufferTail != (CCommand *)0x0) {
        this->m_pCmdBufferTail->m_pNext = pCVar8;
      }
      if (this->m_pCmdBufferHead == (CCommand *)0x0) {
        this->m_pCmdBufferHead = pCVar8;
      }
      this->m_pCmdBufferTail = pCVar8;
      return true;
    }
  }
  return false;
}

Assistant:

void *Alloc(unsigned Requested, unsigned Alignment = 8) // TODO: use alignof(std::max_align_t)
		{
			size_t Offset = Alignment - (reinterpret_cast<uintptr_t>(m_pData + m_Used) % Alignment);
			if(Requested + Offset + m_Used > m_Size)
				return 0;

			void *pPtr = &m_pData[m_Used + Offset];
			m_Used += Requested + Offset;
			return pPtr;
		}